

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O1

path * GetAuthCookieFile(path *__return_storage_ptr__,bool temp)

{
  string arg_00;
  long in_FS_OFFSET;
  path arg;
  char *pcVar1;
  undefined1 in_stack_ffffffffffffff70 [24];
  undefined1 local_68 [72];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"-rpccookiefile","");
  pcVar1 = ".cookie";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&stack0xffffffffffffff70,(char **)&stack0xffffffffffffff68,auto_format);
  arg_00._M_string_length = in_stack_ffffffffffffff70._0_8_;
  arg_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff70._8_16_;
  arg_00._M_dataplus._M_p = pcVar1;
  ArgsManager::GetPathArg((path *)(local_68 + 0x20),&gArgs,arg_00,(path *)local_68);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff70);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (temp) {
    std::filesystem::__cxx11::path::_M_concat(local_68 + 0x20,4,".tmp");
  }
  AbsPathForConfigVal(__return_storage_ptr__,&gArgs,(path *)(local_68 + 0x20),true);
  std::filesystem::__cxx11::path::~path((path *)(local_68 + 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static fs::path GetAuthCookieFile(bool temp=false)
{
    fs::path arg = gArgs.GetPathArg("-rpccookiefile", COOKIEAUTH_FILE);
    if (temp) {
        arg += ".tmp";
    }
    return AbsPathForConfigVal(gArgs, arg);
}